

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::RadioButton(char *label,bool active)

{
  bool bVar1;
  byte in_SIL;
  ImVec2 IVar2;
  ImVec2 IVar3;
  float pad;
  bool pressed;
  bool held;
  bool hovered;
  float radius;
  ImVec2 center;
  ImRect total_bb;
  ImRect check_bb;
  ImVec2 pos;
  float square_sz;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  ImRect *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  ImVec2 *this;
  ImRect *in_stack_fffffffffffffee8;
  ImDrawList *center_00;
  undefined4 in_stack_fffffffffffffef0;
  ImGuiID in_stack_fffffffffffffef4;
  float fVar4;
  ImRect *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff08;
  undefined1 hide_text_after_hash;
  float in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar5;
  bool *in_stack_ffffffffffffff18;
  ImDrawList *text;
  float in_stack_ffffffffffffff20;
  ImGuiID in_stack_ffffffffffffff24;
  float fVar6;
  ImRect *bb;
  float local_cc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  float local_9c;
  byte local_97;
  byte local_96;
  byte local_95;
  float local_94;
  float local_90;
  float fStack_8c;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  ImRect local_78;
  ImVec2 local_68;
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  float local_40;
  ImVec2 local_3c;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    local_34 = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                  (char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    local_3c = CalcTextSize((char *)in_stack_fffffffffffffef8,
                            (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffee8,0));
    local_40 = GetFrameHeight();
    local_48 = (local_20->DC).CursorPos;
    ImVec2::ImVec2(&local_68,local_40,local_40);
    local_60 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                         (ImVec2 *)0x18c250);
    ImRect::ImRect(&local_58,&local_48,&local_60);
    if (local_3c.x <= 0.0) {
      local_cc = 0.0;
    }
    else {
      local_cc = (local_30->ItemInnerSpacing).x + local_3c.x;
    }
    fVar6 = (local_30->FramePadding).y;
    bb = (ImRect *)&stack0xffffffffffffff78;
    ImVec2::ImVec2((ImVec2 *)bb,local_40 + local_cc,fVar6 + fVar6 + local_3c.y);
    IVar2 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                      (ImVec2 *)0x18c317);
    ImRect::ImRect(&local_78,&local_48,(ImVec2 *)&stack0xffffffffffffff80);
    ItemSize(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    bVar1 = ItemAdd(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
    if (bVar1) {
      IVar3 = ImRect::GetCenter((ImRect *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_90 = IVar3.x;
      fStack_8c = IVar3.y;
      _local_90 = CONCAT44((float)(int)(fStack_8c + 0.5),(float)(int)(local_90 + 0.5));
      local_94 = (local_40 - 1.0) * 0.5;
      local_97 = ButtonBehavior(bb,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,
                                (bool *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10
                                                ),
                                (ImGuiButtonFlags)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      hide_text_after_hash = (undefined1)((ulong)in_stack_ffffffffffffff08 >> 0x38);
      if ((bool)local_97) {
        MarkItemEdited(local_34);
      }
      RenderNavHighlight((ImRect *)IVar2,(ImGuiID)in_stack_ffffffffffffff7c,
                         (ImGuiNavHighlightFlags)in_stack_ffffffffffffff78);
      text = local_20->DrawList;
      if (((local_96 & 1) == 0) || ((local_95 & 1) == 0)) {
        uVar5 = 7;
        if ((local_95 & 1) != 0) {
          uVar5 = 8;
        }
      }
      else {
        uVar5 = 9;
      }
      fVar6 = local_94;
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  SUB84(in_stack_fffffffffffffee0,0));
      ImDrawList::AddCircleFilled
                ((ImDrawList *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 &in_stack_fffffffffffffee8->Min,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                 (ImU32)in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      if ((local_11 & 1) != 0) {
        local_9c = ImMax<float>(1.0,(float)(int)(local_40 / 6.0));
        hide_text_after_hash = (undefined1)((ulong)local_20->DrawList >> 0x38);
        in_stack_ffffffffffffff10 = local_94 - local_9c;
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                    SUB84(in_stack_fffffffffffffee0,0));
        ImDrawList::AddCircleFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   &in_stack_fffffffffffffee8->Min,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20)
                   ,(ImU32)in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20)
                  );
      }
      if (0.0 < local_30->FrameBorderSize) {
        center_00 = local_20->DrawList;
        this = &local_ac;
        ImVec2::ImVec2(this,1.0,1.0);
        local_a4 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                             ,(ImVec2 *)0x18c5ea);
        fVar4 = local_94;
        GetColorU32((ImGuiCol)((ulong)this >> 0x20),SUB84(this,0));
        ImDrawList::AddCircle
                  ((ImDrawList *)CONCAT44(fVar4,in_stack_fffffffffffffef0),(ImVec2 *)center_00,
                   (float)((ulong)this >> 0x20),(ImU32)this,
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(float)in_stack_fffffffffffffed8)
        ;
        GetColorU32((ImGuiCol)((ulong)this >> 0x20),SUB84(this,0));
        ImDrawList::AddCircle
                  ((ImDrawList *)CONCAT44(fVar4,in_stack_fffffffffffffef0),(ImVec2 *)center_00,
                   (float)((ulong)this >> 0x20),(ImU32)this,
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(float)in_stack_fffffffffffffed8)
        ;
      }
      if ((local_28->LogEnabled & 1U) != 0) {
        LogRenderedText((ImVec2 *)CONCAT44(fVar6,in_stack_ffffffffffffff20),(char *)text,
                        (char *)CONCAT44(uVar5,in_stack_ffffffffffffff10));
      }
      if (0.0 < local_3c.x) {
        ImVec2::ImVec2(&local_b4,local_58.Max.x + (local_30->ItemInnerSpacing).x,
                       local_58.Min.y + (local_30->FramePadding).y);
        IVar2.y = fVar6;
        IVar2.x = in_stack_ffffffffffffff20;
        RenderText(IVar2,(char *)text,(char *)CONCAT44(uVar5,in_stack_ffffffffffffff10),
                   (bool)hide_text_after_hash);
      }
      local_1 = (bool)(local_97 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::RadioButton(const char* label, bool active)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const float square_sz = GetFrameHeight();
    const ImVec2 pos = window->DC.CursorPos;
    const ImRect check_bb(pos, pos + ImVec2(square_sz, square_sz));
    const ImRect total_bb(pos, pos + ImVec2(square_sz + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), label_size.y + style.FramePadding.y * 2.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id))
        return false;

    ImVec2 center = check_bb.GetCenter();
    center.x = IM_ROUND(center.x);
    center.y = IM_ROUND(center.y);
    const float radius = (square_sz - 1.0f) * 0.5f;

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
        MarkItemEdited(id);

    RenderNavHighlight(total_bb, id);
    window->DrawList->AddCircleFilled(center, radius, GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), 16);
    if (active)
    {
        const float pad = ImMax(1.0f, IM_FLOOR(square_sz / 6.0f));
        window->DrawList->AddCircleFilled(center, radius - pad, GetColorU32(ImGuiCol_CheckMark), 16);
    }

    if (style.FrameBorderSize > 0.0f)
    {
        window->DrawList->AddCircle(center + ImVec2(1, 1), radius, GetColorU32(ImGuiCol_BorderShadow), 16, style.FrameBorderSize);
        window->DrawList->AddCircle(center, radius, GetColorU32(ImGuiCol_Border), 16, style.FrameBorderSize);
    }

    if (g.LogEnabled)
        LogRenderedText(&total_bb.Min, active ? "(x)" : "( )");
    if (label_size.x > 0.0f)
        RenderText(ImVec2(check_bb.Max.x + style.ItemInnerSpacing.x, check_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags);
    return pressed;
}